

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O1

int sys_trim(mstate m,size_t pad)

{
  size_t *psVar1;
  mchunkptr pmVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  msegmentptr sp_1;
  long lVar6;
  mstate pmVar7;
  ulong uVar8;
  ulong __len;
  mstate m_00;
  msegmentptr sp;
  malloc_segment *pmVar9;
  bool bVar10;
  bool bVar11;
  
  m_00 = m;
  if (mparams.magic == 0) {
    init_mparams();
  }
  if ((mstate)0xffffffffffffff7f < m) {
    return 0;
  }
  if (_gm_.top == (mchunkptr)0x0) {
    return 0;
  }
  if (_gm_.topsize <= m->smallbins + 1) {
    __len = 0;
    goto LAB_00104e3f;
  }
  __len = ((((_gm_.topsize - (long)m) + mparams.granularity) - 0x51) / mparams.granularity - 1) *
          mparams.granularity;
  pmVar9 = &_gm_.seg;
  do {
    if (((mchunkptr)pmVar9->base <= _gm_.top) &&
       (_gm_.top < (mchunkptr)((long)&((mchunkptr)pmVar9->base)->prev_foot + pmVar9->size)))
    goto LAB_00104dba;
    pmVar9 = pmVar9->next;
  } while (pmVar9 != (malloc_segment *)0x0);
  pmVar9 = (malloc_segment *)0x0;
LAB_00104dba:
  if ((pmVar9->sflags & 9) == 1) {
    uVar8 = pmVar9->size;
    if (uVar8 < __len) goto LAB_00104dd6;
    m_00 = (mstate)pmVar9->base;
    pmVar7 = (mstate)&_gm_.seg;
    do {
      bVar10 = m_00 <= pmVar7;
      bVar11 = pmVar7 < (mstate)((long)m_00->smallbins + (uVar8 - 0x48));
      if (bVar11 && bVar10) goto LAB_00104dd6;
      pmVar7 = (mstate)pmVar7->topsize;
    } while (pmVar7 != (mstate)0x0);
    if (bVar11 && bVar10) goto LAB_00104dd6;
    pvVar5 = mremap(m_00,uVar8,uVar8 - __len,0);
    if (pvVar5 == (void *)0xffffffffffffffff) {
      m_00 = (mstate)(pmVar9->base + (uVar8 - __len));
      iVar3 = munmap(m_00,__len);
      if (iVar3 != 0) goto LAB_00104dd6;
    }
  }
  else {
LAB_00104dd6:
    __len = 0;
  }
  if (__len != 0) {
    pmVar9->size = pmVar9->size - __len;
    pmVar2 = _gm_.top;
    _gm_.footprint = _gm_.footprint - __len;
    lVar6 = _gm_.topsize - __len;
    uVar8 = (ulong)(-(int)_gm_.top - 0x10U & 0xf);
    _gm_.topsize = lVar6 - uVar8;
    m_00 = (mstate)(_gm_.topsize | 1);
    psVar1 = &(_gm_.top)->head;
    _gm_.top = (mchunkptr)((long)&(_gm_.top)->prev_foot + uVar8);
    *(mstate *)((long)psVar1 + uVar8) = m_00;
    *(undefined8 *)((long)pmVar2 + lVar6 + 8) = 0x50;
    _gm_.trim_check = mparams.trim_threshold;
  }
LAB_00104e3f:
  sVar4 = release_unused_segments(m_00);
  iVar3 = 1;
  if (sVar4 + __len == 0) {
    iVar3 = 0;
    if (_gm_.trim_check < _gm_.topsize) {
      _gm_.trim_check = 0xffffffffffffffff;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int sys_trim(mstate m, size_t pad) {
  size_t released = 0;
  ensure_initialization();
  if (pad < MAX_REQUEST && is_initialized(m)) {
    pad += TOP_FOOT_SIZE; /* ensure enough room for segment overhead */

    if (m->topsize > pad) {
      /* Shrink top space in granularity-size units, keeping at least one */
      size_t unit = mparams.granularity;
      size_t extra = ((m->topsize - pad + (unit - SIZE_T_ONE)) / unit -
                      SIZE_T_ONE) * unit;
      msegmentptr sp = segment_holding(m, (char*)m->top);

      if (!is_extern_segment(sp)) {
        if (is_mmapped_segment(sp)) {
          if (HAVE_MMAP &&
              sp->size >= extra &&
              !has_segment_link(m, sp)) { /* can't shrink if pinned */
            size_t newsize = sp->size - extra;
            (void)newsize; /* placate people compiling -Wunused-variable */
            /* Prefer mremap, fall back to munmap */
            if ((CALL_MREMAP(sp->base, sp->size, newsize, 0) != MFAIL) ||
                (CALL_MUNMAP(sp->base + newsize, extra) == 0)) {
              released = extra;
            }
          }
        }
        else if (HAVE_MORECORE) {
          if (extra >= HALF_MAX_SIZE_T) /* Avoid wrapping negative */
            extra = (HALF_MAX_SIZE_T) + SIZE_T_ONE - unit;
          ACQUIRE_MALLOC_GLOBAL_LOCK();
          {
            /* Make sure end of memory is where we last set it. */
            char* old_br = (char*)(CALL_MORECORE(0));
            if (old_br == sp->base + sp->size) {
              char* rel_br = (char*)(CALL_MORECORE(-extra));
              char* new_br = (char*)(CALL_MORECORE(0));
              if (rel_br != CMFAIL && new_br < old_br)
                released = old_br - new_br;
            }
          }
          RELEASE_MALLOC_GLOBAL_LOCK();
        }
      }

      if (released != 0) {
        sp->size -= released;
        m->footprint -= released;
        init_top(m, m->top, m->topsize - released);
        check_top_chunk(m, m->top);
      }
    }

    /* Unmap any unused mmapped segments */
    if (HAVE_MMAP)
      released += release_unused_segments(m);

    /* On failure, disable autotrim to avoid repeated failed future calls */
    if (released == 0 && m->topsize > m->trim_check)
      m->trim_check = MAX_SIZE_T;
  }

  return (released != 0)? 1 : 0;
}